

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::RenderExitPupil(RealisticCamera *this,Float sx,Float sy,char *filename)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Point2i resolution;
  Ray *in_RDI;
  float fVar1;
  Float FVar2;
  Float FVar3;
  undefined8 uVar5;
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  Point3f pRear;
  Float lx;
  Float fx;
  int x;
  Float ly;
  Float fy;
  int y;
  ImageMetadata *in_stack_00000370;
  string *in_stack_00000378;
  Image *in_stack_00000380;
  Image image;
  int nSamples;
  Point3f pFilm;
  nullptr_t in_stack_fffffffffffffb08;
  nullptr_t pvVar7;
  int x_00;
  Image *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  Float in_stack_fffffffffffffb1c;
  Point3<float> *in_stack_fffffffffffffb20;
  Point3f *in_stack_fffffffffffffb28;
  Ray *in_stack_fffffffffffffb30;
  allocator<char> *in_stack_fffffffffffffb40;
  undefined1 auVar8 [16];
  undefined1 in_stack_fffffffffffffb48 [64];
  Image *in_stack_fffffffffffffb88;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  PixelFormat in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  string *local_390;
  Ray *rCamera;
  RealisticCamera *this_00;
  optional<float> local_370;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_368;
  undefined4 local_328;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_324;
  undefined4 local_2e4;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_2e0;
  undefined4 local_2d0;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2cc;
  undefined4 local_2c4;
  optional<int> local_2c0;
  optional<float> local_2b8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  allocator<char> local_269;
  string local_268 [56];
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  Float local_1d0;
  float local_1cc;
  int local_1c8;
  Float local_1c4;
  float local_1c0;
  int local_1bc;
  nullptr_t local_1b8;
  undefined1 local_1a5;
  undefined1 local_191 [9];
  undefined1 local_188 [32];
  MediumHandle local_168;
  Float local_160 [78];
  Float local_28 [10];
  
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffb10,
             (float)((ulong)in_stack_fffffffffffffb08 >> 0x20),SUB84(in_stack_fffffffffffffb08,0),
             0.0);
  local_28[0] = 2.86986e-42;
  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,
                      (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08
                     );
  local_1a5 = 1;
  rCamera = (Ray *)local_188;
  this_00 = (RealisticCamera *)local_191;
  local_191._1_8_ = rCamera;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb48._8_8_,in_stack_fffffffffffffb48._0_8_,
             in_stack_fffffffffffffb40);
  local_1a5 = 0;
  local_168.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )local_188;
  local_160._0_8_ = 1;
  v._M_array._4_4_ = in_stack_fffffffffffffb1c;
  v._M_array._0_4_ = in_stack_fffffffffffffb18;
  v._M_len = (size_type)in_stack_fffffffffffffb20;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffb10,v);
  ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb10);
  resolution.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffc54;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffc50;
  channels.ptr._4_4_ = in_stack_fffffffffffffc44;
  channels.ptr._0_4_ = in_stack_fffffffffffffc40;
  channels.n._0_4_ = in_stack_fffffffffffffc48;
  channels.n._4_4_ = in_stack_fffffffffffffc4c;
  alloc.memoryResource._4_4_ = in_stack_fffffffffffffc3c;
  alloc.memoryResource._0_4_ = in_stack_fffffffffffffc38;
  Image::Image((Image *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc2c,resolution,channels,
               (ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               alloc);
  local_390 = (string *)&local_168;
  pvVar7 = local_1b8;
  do {
    local_390 = local_390 + -0x20;
    std::__cxx11::string::~string(local_390);
  } while (local_390 != (string *)local_188);
  std::allocator<char>::~allocator((allocator<char> *)local_191);
  for (local_1bc = 0; auVar8 = in_stack_fffffffffffffb48._0_16_, local_1bc < 0x800;
      local_1bc = local_1bc + 1) {
    fVar1 = (float)local_1bc;
    local_1c0 = fVar1 / 2047.0;
    FVar2 = RearElementRadius((RealisticCamera *)0x69849b);
    FVar2 = -FVar2;
    FVar3 = RearElementRadius((RealisticCamera *)0x6984d2);
    local_1c4 = Lerp(fVar1 / 2047.0,FVar2,FVar3);
    for (local_1c8 = 0; local_1c8 < 0x800; local_1c8 = local_1c8 + 1) {
      fVar1 = (float)local_1c8 / 2047.0;
      local_1cc = fVar1;
      FVar2 = RearElementRadius((RealisticCamera *)0x698573);
      FVar2 = -FVar2;
      FVar3 = RearElementRadius((RealisticCamera *)0x6985aa);
      local_1d0 = Lerp(fVar1,FVar2,FVar3);
      LensRearZ((RealisticCamera *)0x698623);
      Point3<float>::Point3
                ((Point3<float> *)in_stack_fffffffffffffb10,(float)((ulong)pvVar7 >> 0x20),
                 SUB84(pvVar7,0),0.0);
      auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_1d0),ZEXT416((uint)local_1d0),
                               ZEXT416((uint)(local_1c4 * local_1c4)));
      fVar1 = auVar8._0_4_;
      FVar2 = RearElementRadius((RealisticCamera *)0x698689);
      FVar3 = RearElementRadius((RealisticCamera *)0x6986a1);
      uVar5 = 0;
      if (fVar1 <= FVar2 * FVar3) {
        VVar6 = Point3<float>::operator-
                          (in_stack_fffffffffffffb20,
                           (Point3<float> *)
                           CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_228 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._8_8_ = uVar5;
        auVar8._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_230 = vmovlpd_avx(auVar8);
        local_220 = local_230;
        local_218 = local_228;
        MediumHandle::TaggedPointer((MediumHandle *)in_stack_fffffffffffffb10,pvVar7);
        Ray::Ray(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (Vector3f *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                 (MediumHandle *)in_stack_fffffffffffffb10);
        FVar2 = TraceLensesFromFilm(this_00,rCamera,in_RDI);
        x_00 = (int)((ulong)pvVar7 >> 0x20);
        if ((FVar2 != 0.0) || (NAN(FVar2))) {
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,x_00,(int)pvVar7);
          Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
        }
        else {
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,x_00,(int)pvVar7);
          Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
        }
      }
      else {
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,(int)((ulong)pvVar7 >> 0x20),
                            (int)pvVar7);
        Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                          in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (auVar8._8_8_,auVar8._0_8_,in_stack_fffffffffffffb40);
  local_370.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_370.set = false;
  local_370._5_3_ = 0;
  pstd::optional<float>::optional(&local_370);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_368 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar4);
  local_328 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_368.__align);
  local_324 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar4);
  local_2e4 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_324.__align);
  local_2e0 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_2d0 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_2e0.__align)
  ;
  local_2c4 = 0;
  local_2cc = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_2cc.__align);
  local_2c0.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_2c0.set = false;
  local_2c0._5_3_ = 0;
  pstd::optional<int>::optional(&local_2c0);
  local_2b8.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_2b8.set = false;
  local_2b8._5_3_ = 0;
  pstd::optional<float>::optional(&local_2b8);
  local_2b0 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_2a8 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_2b0.__align);
  uStack_280 = 0;
  uStack_278 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x698b42);
  Image::Write(in_stack_00000380,in_stack_00000378,in_stack_00000370);
  ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  Image::~Image(in_stack_fffffffffffffb10);
  return;
}

Assistant:

void RealisticCamera::RenderExitPupil(Float sx, Float sy, const char *filename) const {
    Point3f pFilm(sx, sy, 0);

    const int nSamples = 2048;
    Image image(PixelFormat::Float, {nSamples, nSamples}, {"Y"});

    for (int y = 0; y < nSamples; ++y) {
        Float fy = (Float)y / (Float)(nSamples - 1);
        Float ly = Lerp(fy, -RearElementRadius(), RearElementRadius());
        for (int x = 0; x < nSamples; ++x) {
            Float fx = (Float)x / (Float)(nSamples - 1);
            Float lx = Lerp(fx, -RearElementRadius(), RearElementRadius());

            Point3f pRear(lx, ly, LensRearZ());

            if (lx * lx + ly * ly > RearElementRadius() * RearElementRadius())
                image.SetChannel({x, y}, 0, 1.);
            else if (TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr))
                image.SetChannel({x, y}, 0, 0.5);
            else
                image.SetChannel({x, y}, 0, 0.);
        }
    }

    image.Write(filename);
}